

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

logical pnga_sprs_array_destroy(Integer s_a)

{
  _sparse_array *p_Var1;
  int iVar2;
  _sparse_array *p_Var3;
  logical lVar4;
  logical lVar5;
  logical lVar6;
  logical lVar7;
  Integer **ppIVar8;
  long lVar9;
  bool bVar10;
  
  iVar2 = _ga_sync_end;
  lVar9 = s_a + 1000;
  bVar10 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar10) {
    pnga_pgroup_sync(SPA[lVar9].grp);
  }
  if (SPA[lVar9].ready == 0) {
    if (SPA[lVar9].active == 0) {
      bVar10 = true;
      goto LAB_0014a4d2;
    }
    free(SPA[lVar9].val);
    SPA[lVar9].val = (void *)0x0;
    free(SPA[lVar9].idx);
    SPA[lVar9].idx = (Integer *)0x0;
    free(SPA[lVar9].jdx);
    ppIVar8 = &SPA[lVar9].jdx;
    bVar10 = true;
  }
  else {
    lVar4 = pnga_destroy(SPA[lVar9].g_data);
    lVar5 = pnga_destroy(SPA[lVar9].g_i);
    lVar6 = pnga_destroy(SPA[lVar9].g_j);
    lVar7 = pnga_destroy(SPA[lVar9].g_blk);
    if (SPA[lVar9].blkidx != (Integer *)0x0) {
      free(SPA[lVar9].blkidx);
      SPA[lVar9].blkidx = (Integer *)0x0;
    }
    if (SPA[lVar9].blksize != (Integer *)0x0) {
      free(SPA[lVar9].blksize);
      SPA[lVar9].blksize = (Integer *)0x0;
    }
    bVar10 = ((lVar7 != 0 && lVar6 != 0) && lVar5 != 0) && lVar4 != 0;
    if (SPA[lVar9].offset == (Integer *)0x0) goto LAB_0014a4d2;
    free(SPA[lVar9].offset);
    ppIVar8 = &SPA[lVar9].offset;
  }
  *ppIVar8 = (Integer *)0x0;
LAB_0014a4d2:
  p_Var3 = SPA;
  p_Var1 = SPA + lVar9;
  p_Var1->active = 0;
  (&p_Var1->active)[1] = 0;
  if (iVar2 != 0) {
    pnga_pgroup_sync(p_Var3[lVar9].grp);
  }
  return (ulong)bVar10;
}

Assistant:

logical pnga_sprs_array_destroy(Integer s_a)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer ret = 1;
  int local_sync_begin,local_sync_end;
  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl].grp);
  if (SPA[hdl].ready) {
    if (!pnga_destroy(SPA[hdl].g_data)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_i)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_j)) ret = 0;
    if (!pnga_destroy(SPA[hdl].g_blk)) ret = 0;
    if (SPA[hdl].blkidx != NULL) {
      free(SPA[hdl].blkidx);
      SPA[hdl].blkidx = NULL;
    }
    if (SPA[hdl].blksize != NULL) {
      free(SPA[hdl].blksize);
      SPA[hdl].blksize = NULL;
    }
    if (SPA[hdl].offset != NULL) {
      free(SPA[hdl].offset);
      SPA[hdl].offset = NULL;
    }
  } else if (SPA[hdl].active) {
    free(SPA[hdl].val);
    SPA[hdl].val = NULL;
    free(SPA[hdl].idx);
    SPA[hdl].idx = NULL;
    free(SPA[hdl].jdx);
    SPA[hdl].jdx = NULL;
  }
  SPA[hdl].active = 0;
  SPA[hdl].ready = 0;
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl].grp);
  return ret;
}